

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OperationsExecuter.h
# Opt level: O2

bool __thiscall
Refal2::COperationsExecuter::matchLeftWithQulifierSaveToTable_E
          (COperationsExecuter *this,TQualifierIndex qualifier)

{
  bool bVar1;
  
  bVar1 = shiftLeft(this);
  if ((bVar1) && (bVar1 = checkQualifier(this,this->left,qualifier), bVar1)) {
    if (((this->left->super_CUnit).type & UT_LeftParen) != 0) {
      this->left = (CUnitNode *)(this->left->super_CUnit).field_1;
    }
    saveState(this);
    this->tableTop = this->tableTop + 1;
    saveToTable(this,this->left);
    return true;
  }
  return false;
}

Assistant:

inline bool COperationsExecuter::matchLeftWithQulifierSaveToTable_E(
	const TQualifierIndex qualifier )
{
	if( shiftLeft() && checkQualifier( left, qualifier ) ) {
		if( left->IsLeftParen() ) {
			left = left->PairedParen();
		}
		saveState();
		tableTop++;
		saveToTable( left );
		return true;
	} else {
		return false;
	}
}